

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

int __thiscall Node::IsSimpleInteger(Node *this)

{
  int iVar1;
  char *pcVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char local_19;
  Node *pNStack_18;
  char LastChar;
  Node *this_local;
  
  if ((this->Type == 0x1cf) || (this->Type == 0x1d0)) {
    pNStack_18 = this;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->TextValue);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 != 0) {
      local_30._M_current = (char *)std::__cxx11::string::end();
      local_28 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_30,1);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      local_19 = *pcVar3;
      iVar1 = isdigit((int)local_19);
      if ((iVar1 != 0) || (local_19 == '%')) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int Node::IsSimpleInteger(void)
{
	//
	// Base type must be integer
	//
	if ((Type == BAS_V_INTEGER) || (Type == BAS_V_INT))
	{
		//
		// Has to start with a digit
		//
		if (isdigit(TextValue[0]))
		{
			//
			// has to end with a digit or a '%'
			//
			char LastChar = *(TextValue.end() - 1);
			if (isdigit(LastChar) || (LastChar == '%'))
			{
				return 1;
			}
		}
	}

	return 0;
}